

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

string * __thiscall
pbrt::MeasuredBRDF::ToString_abi_cxx11_(string *__return_storage_ptr__,MeasuredBRDF *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<std::__cxx11::string_const&>
            (__return_storage_ptr__,"[ MeasuredBRDF filename: %s ]",&this->filename);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ MeasuredBRDF filename: %s ]", filename);
    }